

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_xml.cpp
# Opt level: O2

LanguagePtr Omega_h::xml::ask_language(void)

{
  int iVar1;
  Language *__p;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *in_RDI;
  LanguagePtr LVar2;
  
  if (ask_language()::ptr == '\0') {
    iVar1 = __cxa_guard_acquire(&ask_language()::ptr);
    if (iVar1 != 0) {
      __cxa_atexit(std::__shared_ptr<Omega_h::Language,_(__gnu_cxx::_Lock_policy)2>::~__shared_ptr,
                   &ask_language::ptr,&__dso_handle);
      __cxa_guard_release(&ask_language()::ptr);
    }
  }
  if ((ask_language::ptr.super___shared_ptr<Omega_h::Language,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) ||
     ((ask_language::ptr.super___shared_ptr<Omega_h::Language,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count == 0)) {
    __p = (Language *)operator_new(0x30);
    build_language();
    std::__shared_ptr<Omega_h::Language,_(__gnu_cxx::_Lock_policy)2>::reset<Omega_h::Language>
              (&ask_language::ptr.super___shared_ptr<Omega_h::Language,_(__gnu_cxx::_Lock_policy)2>,
               __p);
  }
  std::__shared_ptr<Omega_h::Language,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<Omega_h::Language,_(__gnu_cxx::_Lock_policy)2> *)in_RDI,
             &ask_language::ptr.super___shared_ptr<Omega_h::Language,_(__gnu_cxx::_Lock_policy)2>);
  LVar2.super___shared_ptr<Omega_h::Language,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  LVar2.super___shared_ptr<Omega_h::Language,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (LanguagePtr)LVar2.super___shared_ptr<Omega_h::Language,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

LanguagePtr ask_language() {
#ifdef __clang__
#pragma clang diagnostic push
#pragma clang diagnostic ignored "-Wexit-time-destructors"
#endif
  static LanguagePtr ptr;
#ifdef __clang__
#pragma clang diagnostic pop
#endif
  if (ptr.use_count() == 0) {
    ptr.reset(new Language(build_language()));
  }
  return ptr;
}